

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
slang::ast::ElabSystemTaskSymbol::createMessage
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          ElabSystemTaskSymbol *this,ASTContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> args)

{
  BumpAllocator *this_00;
  bool bVar1;
  byte *__dest;
  _Alloc_hider this_01;
  __extent_storage<18446744073709551615UL> args_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  EvalContext evalCtx;
  undefined1 local_3b0 [32];
  bool local_390;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  bitmask<slang::ast::ASTFlags> local_368;
  SourceLocation SStack_360;
  TempVarSymbol *local_358;
  RandomizeDetails *pRStack_350;
  AssertionInstanceDetails *local_348;
  bitmask<slang::ast::EvalFlags> local_340;
  undefined8 local_33c;
  undefined8 uStack_334;
  undefined4 local_32c;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_328;
  LValue **local_270;
  char local_268 [8];
  size_type local_260;
  LValue *local_258 [5];
  SmallVectorBase<slang::Diagnostic> local_230;
  SmallVectorBase<slang::Diagnostic> local_138;
  SourceLocation local_40;
  SourceLocation SStack_38;
  bool local_30;
  
  args_00 = args._M_extent._M_extent_value;
  local_388._8_8_ = args._M_ptr;
  local_388._0_8_ = context;
  bVar1 = FmtHelpers::checkDisplayArgs((ASTContext *)this,(Args *)local_388);
  if (bVar1) {
    local_348 = *(AssertionInstanceDetails **)&(this->super_Symbol).indexInScope;
    local_328.data_ = (pointer)local_328.firstElement;
    local_378._0_8_ = *(undefined8 *)&this->super_Symbol;
    local_378._8_8_ = (this->super_Symbol).name._M_len;
    local_368.m_bits = (underlying_type)(this->super_Symbol).name._M_str;
    SStack_360 = (this->super_Symbol).location;
    local_358 = (TempVarSymbol *)(this->super_Symbol).parentScope;
    pRStack_350 = (RandomizeDetails *)(this->super_Symbol).nextInScope;
    local_340.m_bits = '\0';
    local_33c = 0;
    uStack_334 = 0;
    local_32c = 0;
    local_328.len = 0;
    local_328.cap = 2;
    local_268[0] = '\0';
    local_268[1] = '\0';
    local_268[2] = '\0';
    local_268[3] = '\0';
    local_268[4] = '\0';
    local_268[5] = '\0';
    local_268[6] = '\0';
    local_268[7] = '\0';
    local_260 = 5;
    local_230.data_ = (pointer)local_230.firstElement;
    local_230.len = 0;
    local_230.cap = 2;
    local_138.data_ = (pointer)local_138.firstElement;
    local_138.len = 0;
    local_138.cap = 2;
    local_30 = false;
    local_40 = (SourceLocation)0x0;
    SStack_38 = (SourceLocation)0x0;
    this_01._M_p = *(pointer *)&this->super_Symbol;
    local_270 = local_258;
    FmtHelpers::formatDisplay_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3b0,(FmtHelpers *)this_01._M_p,(Scope *)local_378,(EvalContext *)local_388,
               (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
               args_00._M_extent_value);
    EvalContext::reportAllDiags((EvalContext *)local_378);
    if (local_390 == false) {
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged = false;
    }
    else if (local_3b0._8_8_ == 0) {
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_len = 0;
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str = "";
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged = true;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,0,0,
                 ": ",2);
      this_00 = (BumpAllocator *)**(undefined8 **)&this->super_Symbol;
      __dest = this_00->head->current;
      if (this_00->endPtr < __dest + local_3b0._8_8_) {
        __dest = BumpAllocator::allocateSlow(this_00,local_3b0._8_8_,1);
      }
      else {
        this_00->head->current = __dest + local_3b0._8_8_;
      }
      this_01._M_p = (pointer)local_3b0._0_8_;
      memcpy(__dest,(void *)local_3b0._0_8_,local_3b0._8_8_);
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_len = local_3b0._8_8_;
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str = (char *)__dest;
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged = true;
    }
    if ((local_390 & 1U) != 0) {
      local_390 = false;
      if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
        this_01._M_p = (pointer)(local_3b0._16_8_ + 1);
        operator_delete((void *)local_3b0._0_8_,(size_t)this_01._M_p);
      }
    }
    SmallVectorBase<slang::Diagnostic>::cleanup(&local_138,(EVP_PKEY_CTX *)this_01._M_p);
    SmallVectorBase<slang::Diagnostic>::cleanup(&local_230,(EVP_PKEY_CTX *)this_01._M_p);
    if (local_270 != local_258) {
      operator_delete(local_270);
    }
    SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
              (&local_328,(EVP_PKEY_CTX *)this_01._M_p);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view> ElabSystemTaskSymbol::createMessage(
    const ASTContext& context, std::span<const Expression* const> args) {

    // Check all arguments.
    if (!FmtHelpers::checkDisplayArgs(context, args))
        return {};

    // Format the message to string.
    EvalContext evalCtx(context);
    std::optional<std::string> str = FmtHelpers::formatDisplay(*context.scope, evalCtx, args);
    evalCtx.reportAllDiags();

    if (!str)
        return {};

    if (str->empty())
        return ""sv;

    str->insert(0, ": ");

    // Copy the string into permanent memory.
    auto mem = context.getCompilation().allocate(str->size(), alignof(char));
    memcpy(mem, str->data(), str->size());

    return std::string_view(reinterpret_cast<char*>(mem), str->size());
}